

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_cconvert.c
# Opt level: O1

int sp_cconvert(int m,int n,singlecomplex *A,int lda,int kl,int ku,singlecomplex *a,int_t *asub,
               int_t *xa,int_t *nnz)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  if (n < 1) {
    iVar8 = 0;
  }
  else {
    uVar3 = -ku;
    uVar7 = 0;
    iVar8 = 0;
    do {
      xa[uVar7] = iVar8;
      iVar5 = (int)uVar7 - ku;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar2 = (int)((long)kl + uVar7);
      if ((long)(ulong)(uint)n <= (long)((long)kl + uVar7)) {
        iVar2 = n + -1;
      }
      if (iVar5 <= iVar2) {
        lVar4 = (long)iVar8;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        do {
          a[lVar4] = A[uVar6];
          asub[lVar4] = (int_t)uVar6;
          lVar4 = lVar4 + 1;
          bVar1 = (long)uVar6 < (long)iVar2;
          uVar6 = uVar6 + 1;
        } while (bVar1);
      }
      iVar8 = (iVar8 - iVar5) + iVar2 + 1;
      uVar7 = uVar7 + 1;
      uVar3 = uVar3 + 1;
      A = A + lda;
    } while (uVar7 != (uint)n);
  }
  *nnz = iVar8;
  xa[n] = iVar8;
  return 0;
}

Assistant:

int
sp_cconvert(int m, int n, singlecomplex *A, int lda, int kl, int ku,
	   singlecomplex *a, int_t *asub, int_t *xa, int_t *nnz)
{
    int_t     lasta = 0;
    int_t     i, j, ilow, ihigh;
    int_t     *row;
    singlecomplex  *val;

    for (j = 0; j < n; ++j) {
	xa[j] = lasta;
	val = &a[xa[j]];
	row = &asub[xa[j]];

	ilow = SUPERLU_MAX(0, j - ku);
	ihigh = SUPERLU_MIN(n-1, j + kl);
	for (i = ilow; i <= ihigh; ++i) {
	    val[i-ilow] = A[i + j*lda];
	    row[i-ilow] = i;
	}
	lasta += ihigh - ilow + 1;
    }

    xa[n] = *nnz = lasta;
    return 0;
}